

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementEffects.cpp
# Opt level: O3

void __thiscall Rml::ElementEffects::RenderEffects(ElementEffects *this,RenderStage render_stage)

{
  pointer pDVar1;
  pointer pDVar2;
  pointer pFVar3;
  element_type *peVar4;
  long *plVar5;
  code *pcVar6;
  undefined1 auVar7 [8];
  bool bVar8;
  RenderManager *this_00;
  LayerHandle LVar9;
  LayerHandle destination;
  BoxArea BVar10;
  undefined8 in_RCX;
  undefined8 uVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  Vector2Type VVar15;
  ulong uVar16;
  size_t sVar17;
  FilterEntry *filter;
  pointer pFVar18;
  Rectanglei RVar19;
  Rectangle<int> RVar20;
  Span<const_unsigned_long> filters;
  Span<const_unsigned_long> filters_00;
  FilterHandleList filter_handles;
  Rectanglef filter_region;
  undefined1 local_98 [8];
  Vector2Type VStack_90;
  pointer local_88;
  Rectanglef local_78;
  Rectanglei local_68;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  pointer local_40;
  _Bit_type *local_38;
  
  InstanceEffects(this);
  ReloadEffectsData(this);
  pDVar1 = (this->decorators).
           super__Vector_base<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pDVar2 = (this->decorators).
           super__Vector_base<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar11 = CONCAT71((int7)((ulong)in_RCX >> 8),pDVar1 == pDVar2);
  BVar10 = (BoxArea)uVar11;
  if ((render_stage == Decoration && pDVar1 != pDVar2) &&
     (uVar12 = (uint)((ulong)((long)pDVar2 - (long)pDVar1) >> 5), 0 < (int)uVar12)) {
    uVar13 = (ulong)(uVar12 & 0x7fffffff);
    uVar16 = uVar13 + 1;
    lVar14 = uVar13 * 0x20 + -0x10;
    do {
      pDVar1 = (this->decorators).
               super__Vector_base<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (*(long *)((long)&(pDVar1->decorator).
                           super___shared_ptr<const_Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr + lVar14) != 0) {
        (**(code **)(**(long **)((long)pDVar1 + lVar14 + -0x10) + 0x20))();
      }
      BVar10 = (BoxArea)uVar11;
      uVar16 = uVar16 - 1;
      lVar14 = lVar14 + -0x20;
    } while (1 < uVar16);
  }
  if ((((this->filters).
        super__Vector_base<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->filters).
        super__Vector_base<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
        ._M_impl.super__Vector_impl_data._M_finish) &&
      ((this->backdrop_filters).
       super__Vector_base<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       (this->backdrop_filters).
       super__Vector_base<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
       ._M_impl.super__Vector_impl_data._M_finish)) &&
     ((this->mask_images).
      super__Vector_base<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->mask_images).
      super__Vector_base<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    return;
  }
  this_00 = Element::GetRenderManager(this->element);
  if (this_00 == (RenderManager *)0x0) {
    return;
  }
  local_68 = RenderManager::GetScissorRegion(this_00);
  if (render_stage == Exit) {
    if (((this->filters).
         super__Vector_base<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
         ._M_impl.super__Vector_impl_data._M_start ==
         (this->filters).
         super__Vector_base<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
         ._M_impl.super__Vector_impl_data._M_finish) &&
       ((this->mask_images).
        super__Vector_base<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->mask_images).
        super__Vector_base<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>
        ._M_impl.super__Vector_impl_data._M_finish)) {
      return;
    }
    ElementUtilities::SetClippingRegion(this->element,false);
    local_98._0_4_ = 0.0;
    local_98._4_4_ = 0.0;
    VStack_90.x = -1.0;
    VStack_90.y = -1.0;
    ElementUtilities::GetBoundingBox
              ((ElementUtilities *)local_98,(Rectanglef *)this->element,(Element *)0x4,BVar10);
    pFVar3 = (this->filters).
             super__Vector_base<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pFVar18 = (this->filters).
                   super__Vector_base<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
                   ._M_impl.super__Vector_impl_data._M_start; pFVar18 != pFVar3;
        pFVar18 = pFVar18 + 1) {
      peVar4 = (pFVar18->filter).super___shared_ptr<const_Rml::Filter,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      (*peVar4->_vptr_Filter[3])(peVar4,this->element,local_98);
    }
    Math::ExpandToPixelGrid((Rectanglef *)local_98);
    local_78.p0.y = (float)(int)(float)local_98._4_4_;
    local_78.p0.x = (float)(int)(float)local_98._0_4_;
    local_78.p1.y = (float)(int)VStack_90.y;
    local_78.p1.x = (float)(int)VStack_90.x;
    RVar19 = RenderManager::GetScissorRegion(this_00);
    RVar20 = Rectangle<int>::IntersectIfValid((Rectangle<int> *)&local_78,RVar19);
    RenderManager::SetScissorRegion(this_00,RVar20);
    local_78.p0.x = 0.0;
    local_78.p0.y = 0.0;
    local_78.p1.x = 0.0;
    local_78.p1.y = 0.0;
    local_98._0_4_ = 0.0;
    local_98._4_4_ = 0.0;
    VStack_90.x = 0.0;
    VStack_90.y = 0.0;
    local_88 = (pointer)0x0;
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_98,
               (ulong)((this->mask_images).
                       super__Vector_base<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>
                       ._M_impl.super__Vector_impl_data._M_start !=
                      (this->mask_images).
                      super__Vector_base<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>
                      ._M_impl.super__Vector_impl_data._M_finish) +
               ((long)(this->filters).
                      super__Vector_base<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->filters).
                      super__Vector_base<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5));
    pFVar3 = (this->filters).
             super__Vector_base<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pFVar18 = (this->filters).
                   super__Vector_base<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
                   ._M_impl.super__Vector_impl_data._M_start; pFVar18 != pFVar3;
        pFVar18 = pFVar18 + 1) {
      CompiledFilter::AddHandleTo(&pFVar18->compiled,(FilterHandleList *)local_98);
    }
    if ((this->mask_images).
        super__Vector_base<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (this->mask_images).
        super__Vector_base<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      RenderManager::PushLayer(this_00);
      uVar12 = (uint)((ulong)((long)(this->mask_images).
                                    super__Vector_base<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->mask_images).
                                   super__Vector_base<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 5);
      if (0 < (int)uVar12) {
        uVar13 = (ulong)(uVar12 & 0x7fffffff);
        uVar16 = uVar13 + 1;
        lVar14 = uVar13 * 0x20 + -0x10;
        do {
          pDVar1 = (this->mask_images).
                   super__Vector_base<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (*(long *)((long)&(pDVar1->decorator).
                               super___shared_ptr<const_Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr + lVar14) != 0) {
            plVar5 = *(long **)((long)pDVar1 + lVar14 + -0x10);
            (**(code **)(*plVar5 + 0x20))(plVar5,this->element);
          }
          uVar16 = uVar16 - 1;
          lVar14 = lVar14 + -0x20;
        } while (1 < uVar16);
      }
      RenderManager::SaveLayerAsMaskImage((RenderManager *)&stack0xffffffffffffffa8);
      CompiledFilter::Release((CompiledFilter *)&local_78);
      local_78.p1 = _fStack_50;
      local_78.p0 = _local_58;
      local_58 = 0.0;
      fStack_54 = 0.0;
      fStack_50 = 0.0;
      fStack_4c = 0.0;
      CompiledFilter::Release((CompiledFilter *)&stack0xffffffffffffffa8);
      CompiledFilter::AddHandleTo((CompiledFilter *)&local_78,(FilterHandleList *)local_98);
      RenderManager::PopLayer(this_00);
    }
    LVar9 = RenderManager::GetTopLayer(this_00);
    destination = RenderManager::GetNextLayer(this_00);
    VVar15 = VStack_90;
    auVar7 = local_98;
    if ((VStack_90 == (Vector2Type)0x0 || (Vector2Type)local_98 != (Vector2Type)0x0) ||
       (bVar8 = Assert("RMLUI_ASSERT(data != nullptr || size == 0)",
                       "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/../../Include/RmlUi/Core/Span.h"
                       ,0x2f), bVar8)) {
      filters.m_size = (long)VVar15 - (long)auVar7 >> 3;
      filters.m_data = (unsigned_long *)auVar7;
      RenderManager::CompositeLayers(this_00,LVar9,destination,Blend,filters);
      RenderManager::PopLayer(this_00);
      RenderManager::SetScissorRegion(this_00,local_68);
      if ((Vector2Type)local_98 != (Vector2Type)0x0) {
        operator_delete((void *)local_98,(long)local_88 - (long)local_98);
      }
      CompiledFilter::Release((CompiledFilter *)&local_78);
      return;
    }
LAB_0022834c:
    pcVar6 = (code *)invalidInstructionException();
    (*pcVar6)();
  }
  if (render_stage != Enter) {
    return;
  }
  local_38 = (_Bit_type *)RenderManager::GetTopLayer(this_00);
  if (((this->filters).
       super__Vector_base<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       (this->filters).
       super__Vector_base<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
       ._M_impl.super__Vector_impl_data._M_finish) ||
     ((this->mask_images).
      super__Vector_base<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->mask_images).
      super__Vector_base<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    RenderManager::PushLayer(this_00);
  }
  if ((this->backdrop_filters).
      super__Vector_base<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->backdrop_filters).
      super__Vector_base<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    return;
  }
  local_40 = (pointer)RenderManager::GetTopLayer(this_00);
  local_98._0_4_ = 0.0;
  local_98._4_4_ = 0.0;
  VStack_90.x = -1.0;
  VStack_90.y = -1.0;
  ElementUtilities::GetBoundingBox
            ((ElementUtilities *)local_98,(Rectanglef *)this->element,(Element *)0x1,BVar10);
  pFVar3 = (this->backdrop_filters).
           super__Vector_base<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pFVar18 = (this->backdrop_filters).
                 super__Vector_base<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
                 ._M_impl.super__Vector_impl_data._M_start; pFVar18 != pFVar3; pFVar18 = pFVar18 + 1
      ) {
    peVar4 = (pFVar18->filter).super___shared_ptr<const_Rml::Filter,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    (*peVar4->_vptr_Filter[3])(peVar4,this->element,local_98);
  }
  Math::ExpandToPixelGrid((Rectanglef *)local_98);
  RVar19.p0.x = (int)(float)local_98._0_4_;
  RVar19.p1.x = (int)VStack_90.x;
  RVar19.p0.y = (int)(float)local_98._4_4_;
  RVar19.p1.y = (int)VStack_90.y;
  RenderManager::SetScissorRegion(this_00,RVar19);
  RenderManager::PushLayer(this_00);
  LVar9 = RenderManager::GetTopLayer(this_00);
  local_98._0_4_ = 0.0;
  local_98._4_4_ = 0.0;
  VStack_90.x = 0.0;
  VStack_90.y = 0.0;
  local_88 = (pointer)0x0;
  pFVar18 = (this->backdrop_filters).
            super__Vector_base<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pFVar3 = (this->backdrop_filters).
           super__Vector_base<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pFVar18 == pFVar3) {
    sVar17 = 0;
  }
  else {
    do {
      CompiledFilter::AddHandleTo(&pFVar18->compiled,(FilterHandleList *)local_98);
      pFVar18 = pFVar18 + 1;
    } while (pFVar18 != pFVar3);
    sVar17 = (long)VStack_90 - (long)local_98 >> 3;
    VVar15 = (Vector2Type)local_98;
    if (VStack_90 == (Vector2Type)0x0 || (Vector2Type)local_98 != (Vector2Type)0x0)
    goto LAB_00228258;
    bVar8 = Assert("RMLUI_ASSERT(data != nullptr || size == 0)",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/../../Include/RmlUi/Core/Span.h"
                   ,0x2f);
    if (!bVar8) goto LAB_0022834c;
  }
  VVar15.x = 0.0;
  VVar15.y = 0.0;
LAB_00228258:
  BVar10 = Margin;
  filters_00.m_size = sVar17;
  filters_00.m_data = (unsigned_long *)VVar15;
  RenderManager::CompositeLayers(this_00,(LayerHandle)local_38,LVar9,Blend,filters_00);
  ElementUtilities::SetClippingRegion(this->element,true);
  local_78.p0.x = 0.0;
  local_78.p0.y = 0.0;
  local_78.p1.x = -1.0;
  local_78.p1.y = -1.0;
  ElementUtilities::GetBoundingBox
            ((ElementUtilities *)&local_78,(Rectanglef *)this->element,(Element *)0x1,BVar10);
  Math::ExpandToPixelGrid(&local_78);
  fStack_54 = (float)(int)local_78.p0.y;
  local_58 = (float)(int)local_78.p0.x;
  fStack_4c = (float)(int)local_78.p1.y;
  fStack_50 = (float)(int)local_78.p1.x;
  RVar19 = RenderManager::GetScissorRegion(this_00);
  RVar20 = Rectangle<int>::IntersectIfValid((Rectangle<int> *)&stack0xffffffffffffffa8,RVar19);
  RenderManager::SetScissorRegion(this_00,RVar20);
  RenderManager::CompositeLayers
            (this_00,LVar9,(LayerHandle)local_40,Blend,(Span<const_unsigned_long>)ZEXT816(0));
  RenderManager::PopLayer(this_00);
  RenderManager::SetScissorRegion(this_00,local_68);
  if ((Vector2Type)local_98 != (Vector2Type)0x0) {
    operator_delete((void *)local_98,(long)local_88 - (long)local_98);
  }
  return;
}

Assistant:

void ElementEffects::RenderEffects(RenderStage render_stage)
{
	InstanceEffects();
	ReloadEffectsData();

	if (!decorators.empty())
	{
		if (render_stage == RenderStage::Decoration)
		{
			// Render the decorators attached to this element in its current state.
			// Render from back to front for correct render order.
			for (int i = (int)decorators.size() - 1; i >= 0; i--)
			{
				DecoratorEntry& decorator = decorators[i];
				if (decorator.decorator_data)
					decorator.decorator->RenderElement(element, decorator.decorator_data);
			}
		}
	}

	if (filters.empty() && backdrop_filters.empty() && mask_images.empty())
		return;

	RenderManager* render_manager = element->GetRenderManager();
	if (!render_manager)
		return;

	Rectanglei initial_scissor_region = render_manager->GetScissorRegion();

	auto ApplyClippingRegion = [this, &render_manager](PropertyId filter_id) {
		RMLUI_ASSERT(filter_id == PropertyId::Filter || filter_id == PropertyId::BackdropFilter);

		const bool force_clip_to_self_border_box = (filter_id == PropertyId::BackdropFilter);
		ElementUtilities::SetClippingRegion(element, force_clip_to_self_border_box);

		// Find the region being affected by the active filters and apply it as a scissor.
		Rectanglef filter_region = Rectanglef::MakeInvalid();
		ElementUtilities::GetBoundingBox(filter_region, element, force_clip_to_self_border_box ? BoxArea::Border : BoxArea::Auto);

		// The filter property may draw outside our normal clipping region due to ink overflow.
		if (filter_id == PropertyId::Filter)
		{
			for (const auto& filter : filters)
				filter.filter->ExtendInkOverflow(element, filter_region);
		}

		Math::ExpandToPixelGrid(filter_region);

		Rectanglei scissor_region = Rectanglei(filter_region).IntersectIfValid(render_manager->GetScissorRegion());
		render_manager->SetScissorRegion(scissor_region);
	};
	auto ApplyScissorRegionForBackdrop = [this, &render_manager]() {
		// Set the scissor region for backdrop drawing, which covers the element's border box plus any area we may need
		// to read from, such as any blur radius.
		Rectanglef filter_region = Rectanglef::MakeInvalid();
		ElementUtilities::GetBoundingBox(filter_region, element, BoxArea::Border);
		for (const auto& filter : backdrop_filters)
			filter.filter->ExtendInkOverflow(element, filter_region);
		Math::ExpandToPixelGrid(filter_region);
		render_manager->SetScissorRegion(Rectanglei(filter_region));
	};

	if (render_stage == RenderStage::Enter)
	{
		const LayerHandle backdrop_source_layer = render_manager->GetTopLayer();

		if (!filters.empty() || !mask_images.empty())
		{
			render_manager->PushLayer();
		}

		if (!backdrop_filters.empty())
		{
			const LayerHandle backdrop_destination_layer = render_manager->GetTopLayer();

			// @performance We strictly only need this temporary buffer when having to read from outside the element
			// boundaries, which currently only applies to blur and drop-shadow. Alternatively, we could avoid this
			// completely if we introduced a render interface API concept of different input and output clipping. That
			// is, we set a large input scissor to cover all input data, which can be used e.g. during blurring, and use
			// our small border-area-only clipping region for the composite layers output.
			ApplyScissorRegionForBackdrop();
			render_manager->PushLayer();
			const LayerHandle backdrop_temp_layer = render_manager->GetTopLayer();

			FilterHandleList filter_handles;
			for (auto& filter : backdrop_filters)
				filter.compiled.AddHandleTo(filter_handles);

			// Render the backdrop filters in the extended scissor region including any ink overflow.
			render_manager->CompositeLayers(backdrop_source_layer, backdrop_temp_layer, BlendMode::Blend, filter_handles);

			// Then composite the filter output to our destination while applying our clipping region, including any border-radius.
			ApplyClippingRegion(PropertyId::BackdropFilter);
			render_manager->CompositeLayers(backdrop_temp_layer, backdrop_destination_layer, BlendMode::Blend, {});
			render_manager->PopLayer();
			render_manager->SetScissorRegion(initial_scissor_region);
		}
	}
	else if (render_stage == RenderStage::Exit)
	{
		if (!filters.empty() || !mask_images.empty())
		{
			ApplyClippingRegion(PropertyId::Filter);

			CompiledFilter mask_image_filter;
			FilterHandleList filter_handles;
			filter_handles.reserve(filters.size() + (mask_images.empty() ? 0 : 1));

			for (auto& filter : filters)
				filter.compiled.AddHandleTo(filter_handles);

			if (!mask_images.empty())
			{
				render_manager->PushLayer();

				for (int i = (int)mask_images.size() - 1; i >= 0; i--)
				{
					DecoratorEntry& mask_image = mask_images[i];
					if (mask_image.decorator_data)
						mask_image.decorator->RenderElement(element, mask_image.decorator_data);
				}
				mask_image_filter = render_manager->SaveLayerAsMaskImage();
				mask_image_filter.AddHandleTo(filter_handles);
				render_manager->PopLayer();
			}

			render_manager->CompositeLayers(render_manager->GetTopLayer(), render_manager->GetNextLayer(), BlendMode::Blend, filter_handles);
			render_manager->PopLayer();
			render_manager->SetScissorRegion(initial_scissor_region);
		}
	}
}